

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::SystemLauncher::getUnixCommandLine
          (string *__return_storage_ptr__,SystemLauncher *this,string *commandLine,bool foreground)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,foreground) == 0) {
    ::std::operator+(__return_storage_ptr__,commandLine," &");
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)commandLine);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemLauncher::getUnixCommandLine(const std::string& commandLine,
                                                   bool foreground) const
    {
        std::string launch = foreground ? commandLine : (commandLine + " &");

        return launch;
    }